

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode libcurl_generate_mime_part(CURL *curl,GlobalConfig *config,tool_mime *part,int mimeno)

{
  uint uVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  tool_mime *extraout_RDX;
  tool_mime *extraout_RDX_00;
  GlobalConfig *config_00;
  int submimeno;
  int slistno;
  uint local_30;
  uint local_2c;
  
  config_00 = (GlobalConfig *)((ulong)config & 0xffffffff);
  local_30 = 0;
  pcVar4 = *(char **)((long)curl + 0x28);
  if (*(CURL **)((long)curl + 0x10) == (CURL *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    CVar2 = libcurl_generate_mime_part(*(CURL **)((long)curl + 0x10),config_00,part,mimeno);
    part = extraout_RDX;
  }
  if (CVar2 == CURLE_OK) {
    CVar2 = easysrc_addf(&easysrc_code,"part%d = curl_mime_addpart(mime%d);",config_00,config_00);
    part = extraout_RDX_00;
  }
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  switch(*curl) {
  case 1:
    CVar2 = libcurl_generate_mime
                      (curl,(GlobalConfig *)&stack0xffffffffffffffd0,part,
                       (int *)&switchD_0011d895::switchdataD_0012adfc);
    uVar1 = local_30;
    if ((CVar2 == CURLE_OK) &&
       (CVar2 = easysrc_addf(&easysrc_code,"curl_mime_subparts(part%d, mime%d);",
                             (ulong)config & 0xffffffff,(ulong)local_30), CVar2 == CURLE_OK)) {
      CVar2 = easysrc_addf(&easysrc_code,"mime%d = NULL;",(ulong)uVar1);
    }
    break;
  case 2:
    pcVar3 = c_escape(*(char **)((long)curl + 0x18),-1);
    CVar2 = easysrc_addf(&easysrc_code,"curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                         (ulong)config & 0xffffffff,pcVar3);
    goto LAB_0011d983;
  case 3:
  case 4:
    pcVar3 = c_escape(*(char **)((long)curl + 0x18),-1);
    CVar2 = easysrc_addf(&easysrc_code,"curl_mime_filedata(part%d, \"%s\");",
                         (ulong)config & 0xffffffff,pcVar3);
    if (CVar2 == CURLE_OK && (pcVar4 == (char *)0x0 && *curl == 4)) {
      CVar2 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, NULL);",
                           (ulong)config & 0xffffffff);
    }
LAB_0011d983:
    free(pcVar3);
    break;
  case 5:
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "-";
    }
  case 6:
    CVar2 = easysrc_addf(&easysrc_code,
                         "curl_mime_data_cb(part%d, -1, (curl_read_callback) fread, \\",config_00);
    if (CVar2 == CURLE_OK) {
      CVar2 = easysrc_addf(&easysrc_code,
                           "                  (curl_seek_callback) fseek, NULL, stdin);");
    }
    break;
  default:
    CVar2 = CURLE_OK;
  }
  if (CVar2 == CURLE_OK) {
    if (*(char **)((long)curl + 0x38) == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      pcVar3 = c_escape(*(char **)((long)curl + 0x38),-1);
      CVar2 = easysrc_addf(&easysrc_code,"curl_mime_encoder(part%d, \"%s\");",
                           (ulong)config & 0xffffffff,pcVar3);
      free(pcVar3);
    }
  }
  if (pcVar4 != (char *)0x0 && CVar2 == CURLE_OK) {
    pcVar4 = c_escape(pcVar4,-1);
    CVar2 = easysrc_addf(&easysrc_code,"curl_mime_filename(part%d, \"%s\");",
                         (ulong)config & 0xffffffff,pcVar4);
    free(pcVar4);
  }
  if (CVar2 == CURLE_OK) {
    if (*(char **)((long)curl + 0x20) == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      pcVar4 = c_escape(*(char **)((long)curl + 0x20),-1);
      CVar2 = easysrc_addf(&easysrc_code,"curl_mime_name(part%d, \"%s\");",config_00,pcVar4);
      free(pcVar4);
    }
  }
  if (CVar2 == CURLE_OK) {
    if (*(char **)((long)curl + 0x30) == (char *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      pcVar4 = c_escape(*(char **)((long)curl + 0x30),-1);
      CVar2 = easysrc_addf(&easysrc_code,"curl_mime_type(part%d, \"%s\");",config_00,pcVar4);
      free(pcVar4);
    }
  }
  if (CVar2 == CURLE_OK) {
    if (*(curl_slist **)((long)curl + 0x40) == (curl_slist *)0x0) {
      CVar2 = CURLE_OK;
    }
    else {
      CVar2 = libcurl_generate_slist
                        (*(curl_slist **)((long)curl + 0x40),(int *)&stack0xffffffffffffffd4);
      if ((CVar2 == CURLE_OK) &&
         (CVar2 = easysrc_addf(&easysrc_code,"curl_mime_headers(part%d, slist%d, 1);",
                               (ulong)config & 0xffffffff,(ulong)local_2c), CVar2 == CURLE_OK)) {
        CVar2 = easysrc_addf(&easysrc_code,"slist%d = NULL;",(ulong)local_2c);
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLcode libcurl_generate_mime_part(CURL *curl,
                                           struct GlobalConfig *config,
                                           struct tool_mime *part,
                                           int mimeno)
{
  CURLcode ret = CURLE_OK;
  int submimeno = 0;
  const char *data = NULL;
  const char *filename = part->filename;

  /* Parts are linked in reverse order. */
  if(part->prev)
    ret = libcurl_generate_mime_part(curl, config, part->prev, mimeno);

  /* Create the part. */
  if(!ret)
    ret = easysrc_addf(&easysrc_code, "part%d = curl_mime_addpart(mime%d);",
                       mimeno, mimeno);
  if(ret)
    return ret;

  switch(part->kind) {
  case TOOLMIME_PARTS:
    ret = libcurl_generate_mime(curl, config, part, &submimeno);
    if(!ret) {
      ret = easysrc_addf(&easysrc_code, "curl_mime_subparts(part%d, mime%d);",
                         mimeno, submimeno);
      if(!ret)
        /* Avoid freeing in CLEAN. */
        ret = easysrc_addf(&easysrc_code,
                           "mime%d = NULL;", submimeno);
    }
    break;

  case TOOLMIME_DATA:
    data = part->data;
    if(!ret) {
      char *escaped = c_escape(data, ZERO_TERMINATED);
      ret =
        easysrc_addf(&easysrc_code,
                     "curl_mime_data(part%d, \"%s\", CURL_ZERO_TERMINATED);",
                     mimeno, escaped);
      free(escaped);
    }
    break;

  case TOOLMIME_FILE:
  case TOOLMIME_FILEDATA: {
    char *escaped = c_escape(part->data, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code,
                       "curl_mime_filedata(part%d, \"%s\");", mimeno, escaped);
    if(part->kind == TOOLMIME_FILEDATA && !filename && !ret) {
      ret = easysrc_addf(&easysrc_code,
                         "curl_mime_filename(part%d, NULL);", mimeno);
    }
    free(escaped);
    break;
  }

  case TOOLMIME_STDIN:
    if(!filename)
      filename = "-";
    FALLTHROUGH();
  case TOOLMIME_STDINDATA:
    /* Can only be reading stdin in the current context. */
    ret = easysrc_addf(&easysrc_code, "curl_mime_data_cb(part%d, -1, "
                       "(curl_read_callback) fread, \\", mimeno);
    if(!ret)
      ret = easysrc_addf(&easysrc_code, "                  "
                         "(curl_seek_callback) fseek, NULL, stdin);");
    break;
  default:
    /* Other cases not possible in this context. */
    break;
  }

  if(!ret && part->encoder) {
    char *escaped = c_escape(part->encoder, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_encoder(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && filename) {
    char *escaped = c_escape(filename, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_filename(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && part->name) {
    char *escaped = c_escape(part->name, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_name(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && part->type) {
    char *escaped = c_escape(part->type, ZERO_TERMINATED);
    ret = easysrc_addf(&easysrc_code, "curl_mime_type(part%d, \"%s\");",
                       mimeno, escaped);
    free(escaped);
  }

  if(!ret && part->headers) {
    int slistno;

    ret = libcurl_generate_slist(part->headers, &slistno);
    if(!ret) {
      ret = easysrc_addf(&easysrc_code,
                         "curl_mime_headers(part%d, slist%d, 1);",
                         mimeno, slistno);
      if(!ret)
        ret = easysrc_addf(&easysrc_code,
                           "slist%d = NULL;", slistno); /* Prevent CLEANing. */
    }
  }

  return ret;
}